

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_utils.c
# Opt level: O0

void bake_insert_uni_query_db(char *table_name,int field_count,char **query)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  int local_48;
  int local_44;
  int i_1;
  int insert_pos;
  int i;
  int sql_insert_query_length;
  char *query_ending;
  char *query_middle;
  char *query_beginning;
  char **query_local;
  int field_count_local;
  char *table_name_local;
  
  sVar2 = strlen("INSERT INTO ");
  sVar3 = strlen(table_name);
  sVar4 = strlen(" VALUES (");
  sVar5 = strlen(");");
  insert_pos = (int)sVar2 + (int)sVar3 + (int)sVar4 + (int)sVar5 + 1;
  for (i_1 = 0; i_1 < field_count; i_1 = i_1 + 1) {
    insert_pos = (9 < i_1) + 4 + insert_pos;
  }
  pcVar6 = (char *)malloc((long)insert_pos);
  *query = pcVar6;
  if (*query != (char *)0x0) {
    local_44 = snprintf(*query,(long)insert_pos,"%s%s%s","INSERT INTO ",table_name," VALUES (");
    for (local_48 = 0; local_48 < field_count + -1; local_48 = local_48 + 1) {
      iVar1 = snprintf(*query + local_44,(long)insert_pos,"?%i, ",(ulong)(local_48 + 1));
      local_44 = iVar1 + local_44;
    }
    iVar1 = snprintf(*query + local_44,(long)insert_pos,"?%i ",(ulong)(uint)field_count);
    snprintf(*query + (iVar1 + local_44),(long)insert_pos,"%s",");");
  }
  return;
}

Assistant:

void bake_insert_uni_query_db(const char *table_name, int field_count, char **query) {
    char *query_beginning = "INSERT INTO ";
    char *query_middle = " VALUES (";
    char *query_ending = ");";

    int sql_insert_query_length = strlen(query_beginning) + strlen(table_name) + strlen(query_middle) + strlen(query_ending) + 1;
    for (int i = 0; i < field_count; i++)
        sql_insert_query_length += 4 + ((i > 9) ? 1 : 0);


    *query = malloc(sql_insert_query_length * sizeof(char));
    if (*query == NULL) {
        return;
    }
    int insert_pos = 0;

    insert_pos += snprintf(*query, sql_insert_query_length, "%s%s%s", query_beginning, table_name, query_middle);
    for (int i = 0; i < field_count - 1; i++)
        insert_pos += snprintf(*query + insert_pos, sql_insert_query_length, "?%i, ", i + 1);
    insert_pos += snprintf(*query + insert_pos, sql_insert_query_length, "?%i ", field_count - 1 + 1);
    insert_pos += snprintf(*query + insert_pos, sql_insert_query_length, "%s", query_ending);
}